

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O2

int StartScanRequestRPLIDAR(RPLIDAR *pRPLIDAR)

{
  int iVar1;
  char *__s;
  int DataType;
  int SendMode;
  int DataResponseLength;
  uchar reqbuf [2];
  
  DataResponseLength = 0;
  reqbuf[0] = 0xa5;
  reqbuf[1] = ' ';
  SendMode = 0;
  DataType = 0;
  iVar1 = WriteAllRS232Port(&pRPLIDAR->RS232Port,reqbuf,2);
  if (iVar1 == 0) {
    iVar1 = GetResponseDescriptorRPLIDAR(pRPLIDAR,&DataResponseLength,&SendMode,&DataType);
    if (iVar1 != 0) {
      return 1;
    }
    __s = "A RPLIDAR is not responding correctly : Bad response descriptor. ";
    if (((DataResponseLength == 5) && (SendMode == 1)) && (DataType == 0x81)) {
      return 0;
    }
  }
  else {
    __s = "Error writing data to a RPLIDAR. ";
  }
  puts(__s);
  return 1;
}

Assistant:

inline int StartScanRequestRPLIDAR(RPLIDAR* pRPLIDAR)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
	if (SL_IS_FAIL(pRPLIDAR->drv->startScan(false, false)))
	{
		printf("A RPLIDAR is not responding correctly : startScan() failed. \n");
		return EXIT_FAILURE;
	}
	pRPLIDAR->nodes_cache->clear();
#else
	unsigned char reqbuf[] = {START_FLAG1_RPLIDAR,SCAN_REQUEST_RPLIDAR};
	int DataResponseLength = 0, SendMode = 0, DataType = 0;

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}

	// Receive the response descriptor.
	if (GetResponseDescriptorRPLIDAR(pRPLIDAR, &DataResponseLength, &SendMode, &DataType) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Quick check of the response descriptor.
	if ((DataResponseLength != NB_BYTES_SCAN_DATA_RESPONSE_RPLIDAR)||
		(SendMode != SINGLE_REQUEST_MULTIPLE_RESPONSE_SEND_MODE_RPLIDAR)||
		(DataType != MEASUREMENT_RESPONSE_RPLIDAR))
	{ 
		printf("A RPLIDAR is not responding correctly : Bad response descriptor. \n");
		return EXIT_FAILURE;	
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}